

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

int isdeclare(char *c)

{
  char cVar1;
  int iVar2;
  char *__s1;
  uint uVar3;
  
  __s1 = c + -1;
  do {
    cVar1 = __s1[1];
    __s1 = __s1 + 1;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  uVar3 = 1;
  if (cVar1 != '#') {
    iVar2 = strncmp(__s1,"extern",6);
    if (iVar2 != 0) {
      iVar2 = strncmp(__s1,"typedef",7);
      if (iVar2 != 0) {
        iVar2 = strncmp(__s1,"using",5);
        uVar3 = (uint)(iVar2 == 0);
      }
    }
  }
  return uVar3;
}

Assistant:

int isdeclare(const char *c) {
  while (isspace(*c)) c++;
  if (*c == '#') return 1;
  if (!strncmp(c,"extern",6)) return 1;
  if (!strncmp(c,"typedef",7)) return 1;
  if (!strncmp(c,"using",5)) return 1;
  return 0;
}